

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CaseStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CaseStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::CaseItemSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          Token *args_4,ExpressionSyntax *args_5,Token *args_6,Token *args_7,
          SyntaxList<slang::syntax::CaseItemSyntax> *args_8,Token *args_9)

{
  size_t sVar1;
  pointer ppCVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  Info *pIVar6;
  Info *pIVar7;
  Info *pIVar8;
  SyntaxNode *pSVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  TokenKind TVar18;
  undefined1 uVar19;
  NumericTokenFlags NVar20;
  uint32_t uVar21;
  TokenKind TVar22;
  undefined1 uVar23;
  NumericTokenFlags NVar24;
  uint32_t uVar25;
  TokenKind TVar26;
  undefined1 uVar27;
  NumericTokenFlags NVar28;
  uint32_t uVar29;
  undefined4 uVar30;
  TokenKind TVar31;
  undefined1 uVar32;
  NumericTokenFlags NVar33;
  uint32_t uVar34;
  long lVar35;
  CaseStatementSyntax *this_00;
  
  this_00 = (CaseStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CaseStatementSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (CaseStatementSyntax *)allocateSlow(this,0xf8,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  TVar10 = args_2->kind;
  uVar11 = args_2->field_0x2;
  NVar12.raw = (args_2->numFlags).raw;
  uVar13 = args_2->rawLen;
  pIVar3 = args_2->info;
  TVar14 = args_3->kind;
  uVar15 = args_3->field_0x2;
  NVar16.raw = (args_3->numFlags).raw;
  uVar17 = args_3->rawLen;
  pIVar4 = args_3->info;
  TVar18 = args_4->kind;
  uVar19 = args_4->field_0x2;
  NVar20.raw = (args_4->numFlags).raw;
  uVar21 = args_4->rawLen;
  pIVar5 = args_4->info;
  TVar22 = args_6->kind;
  uVar23 = args_6->field_0x2;
  NVar24.raw = (args_6->numFlags).raw;
  uVar25 = args_6->rawLen;
  pIVar6 = args_6->info;
  TVar26 = args_7->kind;
  uVar27 = args_7->field_0x2;
  NVar28.raw = (args_7->numFlags).raw;
  uVar29 = args_7->rawLen;
  pIVar7 = args_7->info;
  TVar31 = args_9->kind;
  uVar32 = args_9->field_0x2;
  NVar33.raw = (args_9->numFlags).raw;
  uVar34 = args_9->rawLen;
  pIVar8 = args_9->info;
  slang::syntax::StatementSyntax::StatementSyntax
            (&this_00->super_StatementSyntax,CaseStatement,*args,args_1);
  (this_00->uniqueOrPriority).kind = TVar10;
  (this_00->uniqueOrPriority).field_0x2 = uVar11;
  (this_00->uniqueOrPriority).numFlags = (NumericTokenFlags)NVar12.raw;
  (this_00->uniqueOrPriority).rawLen = uVar13;
  (this_00->uniqueOrPriority).info = pIVar3;
  (this_00->caseKeyword).kind = TVar14;
  (this_00->caseKeyword).field_0x2 = uVar15;
  (this_00->caseKeyword).numFlags = (NumericTokenFlags)NVar16.raw;
  (this_00->caseKeyword).rawLen = uVar17;
  (this_00->caseKeyword).info = pIVar4;
  (this_00->openParen).kind = TVar18;
  (this_00->openParen).field_0x2 = uVar19;
  (this_00->openParen).numFlags = (NumericTokenFlags)NVar20.raw;
  (this_00->openParen).rawLen = uVar21;
  (this_00->openParen).info = pIVar5;
  (this_00->expr).ptr = args_5;
  (this_00->closeParen).kind = TVar22;
  (this_00->closeParen).field_0x2 = uVar23;
  (this_00->closeParen).numFlags = (NumericTokenFlags)NVar24.raw;
  (this_00->closeParen).rawLen = uVar25;
  (this_00->closeParen).info = pIVar6;
  (this_00->matchesOrInside).kind = TVar26;
  (this_00->matchesOrInside).field_0x2 = uVar27;
  (this_00->matchesOrInside).numFlags = (NumericTokenFlags)NVar28.raw;
  (this_00->matchesOrInside).rawLen = uVar29;
  (this_00->matchesOrInside).info = pIVar7;
  uVar30 = *(undefined4 *)&(args_8->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar9 = (args_8->super_SyntaxListBase).super_SyntaxNode.parent;
  (this_00->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (args_8->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this_00->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar30;
  (this_00->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar9;
  (this_00->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args_8->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this_00->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0062ede0;
  (this_00->items).super_SyntaxListBase.childCount = (args_8->super_SyntaxListBase).childCount;
  sVar1 = (args_8->super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this_00->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>._M_ptr =
       (args_8->super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>)._M_ptr;
  (this_00->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this_00->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0062fa20;
  (this_00->endcase).kind = TVar31;
  (this_00->endcase).field_0x2 = uVar32;
  (this_00->endcase).numFlags = (NumericTokenFlags)NVar33.raw;
  (this_00->endcase).rawLen = uVar34;
  (this_00->endcase).info = pIVar8;
  (args_5->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  (this_00->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this_00;
  sVar1 = (this_00->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppCVar2 = (this_00->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>.
              _M_ptr;
    lVar35 = 0;
    do {
      *(CaseStatementSyntax **)(*(long *)((long)ppCVar2 + lVar35) + 8) = this_00;
      lVar35 = lVar35 + 8;
    } while (sVar1 << 3 != lVar35);
  }
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }